

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotUTF8(UnicodeSetStringSpan *this,uint8_t *s,int32_t length)

{
  uint uVar1;
  uint8_t *puVar2;
  int32_t *piVar3;
  UBool UVar4;
  int32_t iVar5;
  ulong uVar6;
  int iVar7;
  int length_00;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint8_t *t;
  
  uVar1 = this->strings->count;
  iVar9 = 0;
  lVar8 = 0;
  if (this->all != '\0') {
    lVar8 = (long)(int)uVar1 * 2;
  }
  puVar2 = this->spanLengths;
  uVar6 = 0;
  iVar7 = length;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  while( true ) {
    iVar5 = UnicodeSet::spanUTF8
                      (this->pSpanNotSet,(char *)(s + iVar9),iVar7,USET_SPAN_NOT_CONTAINED);
    length_00 = iVar7 - iVar5;
    if (length_00 == 0) {
      return length;
    }
    iVar9 = iVar5 + iVar9;
    iVar5 = spanOneUTF8(&this->spanSet,s + iVar9,length_00);
    if (0 < iVar5) break;
    piVar3 = this->utf8Lengths;
    t = this->utf8;
    for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      iVar7 = piVar3[uVar10];
      if (((((long)iVar7 != 0) && (iVar7 <= length_00)) && (puVar2[uVar10 + lVar8] != 0xff)) &&
         (UVar4 = matches8(s + iVar9,t,iVar7), UVar4 != '\0')) {
        return iVar9;
      }
      t = t + iVar7;
    }
    iVar9 = iVar9 - iVar5;
    iVar7 = length_00 + iVar5;
    if (length_00 + iVar5 == 0) {
      return length;
    }
  }
  return iVar9;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotUTF8(const uint8_t *s, int32_t length) const {
    int32_t pos=0, rest=length;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanUTF8Lengths=spanLengths;
    if(all) {
        spanUTF8Lengths+=2*stringsLength;
    }
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        i=pSpanNotSet->spanUTF8((const char *)s+pos, rest, USET_SPAN_NOT_CONTAINED);
        if(i==rest) {
            return length;  // Reached the end of the string.
        }
        pos+=i;
        rest-=i;

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneUTF8(spanSet, s+pos, rest);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        const uint8_t *s8=utf8;
        int32_t length8;
        for(i=0; i<stringsLength; ++i) {
            length8=utf8Lengths[i];
            // ALL_CP_CONTAINED: Irrelevant string.
            if(length8!=0 && spanUTF8Lengths[i]!=ALL_CP_CONTAINED && length8<=rest && matches8(s+pos, s8, length8)) {
                return pos;  // There is a set element at pos.
            }
            s8+=length8;
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos-=cpLength;
        rest+=cpLength;
    } while(rest!=0);
    return length;  // Reached the end of the string.
}